

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::ArrayFeatureType::ByteSizeLong(ArrayFeatureType *this)

{
  bool bVar1;
  int iVar2;
  ArrayFeatureType_ArrayDataType AVar3;
  ShapeFlexibilityCase SVar4;
  DefaultOptionalValueCase DVar5;
  int32_t value;
  size_t sVar6;
  long lVar7;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t sStack_30;
  uint32_t cached_has_bits;
  size_t total_size;
  ArrayFeatureType *this_local;
  memory_order __b;
  
  sStack_30 = 0;
  sVar6 = google::protobuf::internal::WireFormatLite::Int64Size(&this->shape_);
  if (sVar6 != 0) {
    sStack_30 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar6);
    sStack_30 = sStack_30 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar6);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->_shape_cached_byte_size_).super___atomic_base<int>._M_i = iVar2;
  sStack_30 = sVar6 + sStack_30;
  AVar3 = _internal_datatype(this);
  if (AVar3 != ArrayFeatureType_ArrayDataType_INVALID_ARRAY_DATA_TYPE) {
    AVar3 = _internal_datatype(this);
    sVar6 = google::protobuf::internal::WireFormatLite::EnumSize(AVar3);
    sStack_30 = sVar6 + 1 + sStack_30;
  }
  SVar4 = ShapeFlexibility_case(this);
  if (SVar4 != SHAPEFLEXIBILITY_NOT_SET) {
    if (SVar4 == kEnumeratedShapes) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSize<CoreML::Specification::ArrayFeatureType_EnumeratedShapes>
                        ((this->ShapeFlexibility_).enumeratedshapes_);
      sStack_30 = sVar6 + 2 + sStack_30;
    }
    else if (SVar4 == kShapeRange) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSize<CoreML::Specification::ArrayFeatureType_ShapeRange>
                        ((this->ShapeFlexibility_).shaperange_);
      sStack_30 = sVar6 + 2 + sStack_30;
    }
  }
  DVar5 = defaultOptionalValue_case(this);
  if (DVar5 != DEFAULTOPTIONALVALUE_NOT_SET) {
    if (DVar5 == kIntDefaultValue) {
      value = _internal_intdefaultvalue(this);
      sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(value);
      sStack_30 = sVar6 + 2 + sStack_30;
    }
    else if (DVar5 == kFloatDefaultValue) {
      sStack_30 = sStack_30 + 6;
    }
    else if (DVar5 == kDoubleDefaultValue) {
      sStack_30 = sStack_30 + 10;
    }
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar7 = std::__cxx11::string::size();
    sStack_30 = lVar7 + sStack_30;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_30);
  SetCachedSize(this,iVar2);
  return sStack_30;
}

Assistant:

size_t ArrayFeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ArrayFeatureType)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated int64 shape = 1;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int64Size(this->shape_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _shape_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
  if (this->_internal_datatype() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_datatype());
  }

  switch (ShapeFlexibility_case()) {
    // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
    case kEnumeratedShapes: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ShapeFlexibility_.enumeratedshapes_);
      break;
    }
    // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
    case kShapeRange: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ShapeFlexibility_.shaperange_);
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  switch (defaultOptionalValue_case()) {
    // int32 intDefaultValue = 41;
    case kIntDefaultValue: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_intdefaultvalue());
      break;
    }
    // float floatDefaultValue = 51;
    case kFloatDefaultValue: {
      total_size += 2 + 4;
      break;
    }
    // double doubleDefaultValue = 61;
    case kDoubleDefaultValue: {
      total_size += 2 + 8;
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}